

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void star_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_elems *v;
  anon_struct_40_4_d8687ec6_for_rules *v_00;
  uint uVar1;
  Elem **ppEVar2;
  Rule *pRVar3;
  Rule **ppRVar4;
  Production *pPVar5;
  Rule *pRVar6;
  Elem *pEVar7;
  void *__s;
  undefined8 *puVar8;
  Rule **ppRVar9;
  
  pPVar5 = new_internal_production(g,g->p);
  pPVar5->field_0x3c = pPVar5->field_0x3c & 0xe3 | 0xc;
  pRVar6 = (Rule *)malloc(0xa8);
  memset(pRVar6,0,0xa8);
  pRVar6->prod = pPVar5;
  pEVar7 = (Elem *)malloc(0x20);
  pEVar7->kind = ELEM_NTERM;
  pEVar7->index = 0;
  pEVar7->rule = (Rule *)0x0;
  (pEVar7->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar7->e + 8) = 0;
  pRVar6->end = pEVar7;
  pEVar7->kind = ELEM_END;
  pEVar7->rule = pRVar6;
  pRVar6->action_index = g->action_index;
  v = &pRVar6->elems;
  ppEVar2 = (pRVar6->elems).v;
  if (g->right_recursive_BNF == 0) {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar7 = (Elem *)malloc(0x20);
      (pEVar7->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar7->e + 8) = 0;
      pEVar7->kind = ELEM_NTERM;
      pEVar7->index = 0;
      pEVar7->rule = (Rule *)0x0;
      (pEVar7->e).nterm = pPVar5;
      pEVar7->rule = pRVar6;
      (pRVar6->elems).v = (pRVar6->elems).e;
      uVar1 = (pRVar6->elems).n;
      (pRVar6->elems).n = uVar1 + 1;
      (pRVar6->elems).e[uVar1] = pEVar7;
    }
    else {
      uVar1 = (pRVar6->elems).n;
      if (ppEVar2 == (pRVar6->elems).e) {
        if (2 < uVar1) goto LAB_0013bc10;
        pEVar7 = (Elem *)malloc(0x20);
        (pEVar7->e).nterm = (Production *)0x0;
        *(undefined8 *)((long)&pEVar7->e + 8) = 0;
        pEVar7->kind = ELEM_NTERM;
        pEVar7->index = 0;
        pEVar7->rule = (Rule *)0x0;
        (pEVar7->e).nterm = pPVar5;
        pEVar7->rule = pRVar6;
      }
      else {
        if ((uVar1 & 7) == 0) {
LAB_0013bc10:
          puVar8 = (undefined8 *)malloc(0x20);
          puVar8[2] = 0;
          puVar8[3] = 0;
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar8[2] = pPVar5;
          puVar8[1] = pRVar6;
          vec_add_internal(v,puVar8);
          goto LAB_0013bc3b;
        }
        pEVar7 = (Elem *)malloc(0x20);
        (pEVar7->e).nterm = (Production *)0x0;
        *(undefined8 *)((long)&pEVar7->e + 8) = 0;
        pEVar7->kind = ELEM_NTERM;
        pEVar7->index = 0;
        pEVar7->rule = (Rule *)0x0;
        (pEVar7->e).nterm = pPVar5;
        pEVar7->rule = pRVar6;
      }
      (pRVar6->elems).n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar7;
    }
LAB_0013bc3b:
    ppEVar2 = (pRVar6->elems).v;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar7 = (g->r->elems).v[(g->r->elems).n - 1];
      (pRVar6->elems).v = (pRVar6->elems).e;
      uVar1 = (pRVar6->elems).n;
      (pRVar6->elems).n = uVar1 + 1;
      (pRVar6->elems).e[uVar1] = pEVar7;
    }
    else {
      uVar1 = (pRVar6->elems).n;
      if (ppEVar2 == (pRVar6->elems).e) {
        if (2 < uVar1) goto LAB_0013bcca;
        pEVar7 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      else {
        if ((uVar1 & 7) == 0) {
LAB_0013bcca:
          vec_add_internal(v,(g->r->elems).v[(g->r->elems).n - 1]);
          goto LAB_0013bce6;
        }
        pEVar7 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      v->n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar7;
    }
LAB_0013bce6:
    pRVar3 = g->r;
    pEVar7 = (Elem *)malloc(0x20);
    (pEVar7->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar7->e + 8) = 0;
    pEVar7->kind = ELEM_NTERM;
    pEVar7->index = 0;
    pEVar7->rule = (Rule *)0x0;
    (pEVar7->e).nterm = pPVar5;
    pEVar7->rule = pRVar3;
    (pRVar3->elems).v[(pRVar3->elems).n - 1] = pEVar7;
    (pRVar6->elems).v[(pRVar6->elems).n - 1]->rule = pRVar6;
  }
  else {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar7 = (g->r->elems).v[(g->r->elems).n - 1];
      (pRVar6->elems).v = (pRVar6->elems).e;
      uVar1 = (pRVar6->elems).n;
      (pRVar6->elems).n = uVar1 + 1;
      (pRVar6->elems).e[uVar1] = pEVar7;
    }
    else {
      uVar1 = (pRVar6->elems).n;
      if (ppEVar2 == (pRVar6->elems).e) {
        if (2 < uVar1) goto LAB_0013ba94;
        pEVar7 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      else {
        if ((uVar1 & 7) == 0) {
LAB_0013ba94:
          vec_add_internal(v,(g->r->elems).v[(g->r->elems).n - 1]);
          goto LAB_0013bab0;
        }
        pEVar7 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      v->n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar7;
    }
LAB_0013bab0:
    pRVar3 = g->r;
    pEVar7 = (Elem *)malloc(0x20);
    (pEVar7->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar7->e + 8) = 0;
    pEVar7->kind = ELEM_NTERM;
    pEVar7->index = 0;
    pEVar7->rule = (Rule *)0x0;
    (pEVar7->e).nterm = pPVar5;
    pEVar7->rule = pRVar3;
    (pRVar3->elems).v[(pRVar3->elems).n - 1] = pEVar7;
    ppEVar2 = (pRVar6->elems).v;
    uVar1 = (pRVar6->elems).n;
    ppEVar2[uVar1 - 1]->rule = pRVar6;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar7 = (Elem *)malloc(0x20);
      (pEVar7->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar7->e + 8) = 0;
      pEVar7->kind = ELEM_NTERM;
      pEVar7->index = 0;
      pEVar7->rule = (Rule *)0x0;
      (pEVar7->e).nterm = pPVar5;
      pEVar7->rule = pRVar6;
      (pRVar6->elems).v = (pRVar6->elems).e;
      (pRVar6->elems).n = uVar1 + 1;
      (pRVar6->elems).e[uVar1] = pEVar7;
    }
    else {
      if (ppEVar2 == (pRVar6->elems).e) {
        if (2 < uVar1) goto LAB_0013bb77;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013bb77:
        puVar8 = (undefined8 *)malloc(0x20);
        puVar8[2] = 0;
        puVar8[3] = 0;
        *puVar8 = 0;
        puVar8[1] = 0;
        puVar8[2] = pPVar5;
        puVar8[1] = pRVar6;
        vec_add_internal(v,puVar8);
        goto LAB_0013bd2b;
      }
      pEVar7 = (Elem *)malloc(0x20);
      (pEVar7->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar7->e + 8) = 0;
      pEVar7->kind = ELEM_NTERM;
      pEVar7->index = 0;
      pEVar7->rule = (Rule *)0x0;
      (pEVar7->e).nterm = pPVar5;
      pEVar7->rule = pRVar6;
      (pRVar6->elems).n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar7;
    }
  }
LAB_0013bd2b:
  v_00 = &pPVar5->rules;
  ppRVar4 = (pPVar5->rules).v;
  ppRVar9 = (pPVar5->rules).e;
  if (ppRVar4 == (Rule **)0x0) {
    (pPVar5->rules).v = ppRVar9;
    uVar1 = (pPVar5->rules).n;
    (pPVar5->rules).n = uVar1 + 1;
    (pPVar5->rules).e[uVar1] = pRVar6;
  }
  else {
    uVar1 = v_00->n;
    if (ppRVar4 == ppRVar9) {
      if (2 < uVar1) goto LAB_0013bd78;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013bd78:
      vec_add_internal(v_00,pRVar6);
      goto LAB_0013bd83;
    }
    v_00->n = uVar1 + 1;
    ppRVar4[uVar1] = pRVar6;
  }
LAB_0013bd83:
  ppRVar4 = (pPVar5->rules).v;
  if (ppRVar4 == (Rule **)0x0) {
    pRVar6 = (Rule *)malloc(0xa8);
    memset(pRVar6,0,0xa8);
    pRVar6->prod = pPVar5;
    pEVar7 = (Elem *)malloc(0x20);
    pEVar7->kind = ELEM_NTERM;
    pEVar7->index = 0;
    pEVar7->rule = (Rule *)0x0;
    (pEVar7->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar7->e + 8) = 0;
    pRVar6->end = pEVar7;
    pEVar7->kind = ELEM_END;
    pEVar7->rule = pRVar6;
    pRVar6->action_index = g->action_index;
    (pPVar5->rules).v = ppRVar9;
    uVar1 = (pPVar5->rules).n;
    (pPVar5->rules).n = uVar1 + 1;
    (pPVar5->rules).e[uVar1] = pRVar6;
  }
  else {
    uVar1 = (pPVar5->rules).n;
    if (ppRVar4 == ppRVar9) {
      if (2 < uVar1) goto LAB_0013be80;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013be80:
      __s = malloc(0xa8);
      memset(__s,0,0xa8);
      *(Production **)((long)__s + 8) = pPVar5;
      puVar8 = (undefined8 *)malloc(0x20);
      *puVar8 = 0;
      puVar8[1] = 0;
      puVar8[2] = 0;
      puVar8[3] = 0;
      *(undefined8 **)((long)__s + 0x48) = puVar8;
      *(undefined4 *)puVar8 = 3;
      puVar8[1] = __s;
      *(int *)((long)__s + 0x98) = g->action_index;
      vec_add_internal(v_00,__s);
      return;
    }
    pRVar6 = (Rule *)malloc(0xa8);
    memset(pRVar6,0,0xa8);
    pRVar6->prod = pPVar5;
    pEVar7 = (Elem *)malloc(0x20);
    pEVar7->kind = ELEM_NTERM;
    pEVar7->index = 0;
    pEVar7->rule = (Rule *)0x0;
    (pEVar7->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar7->e + 8) = 0;
    pRVar6->end = pEVar7;
    pEVar7->kind = ELEM_END;
    pEVar7->rule = pRVar6;
    pRVar6->action_index = g->action_index;
    uVar1 = (pPVar5->rules).n;
    (pPVar5->rules).n = uVar1 + 1;
    (pPVar5->rules).v[uVar1] = pRVar6;
  }
  return;
}

Assistant:

void star_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_STAR;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
  } else {
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
  }
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
}